

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
generateVaryingSSBOShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GLenum shaderType,
          SsboArgs *args,TestLog *log)

{
  _Base_ptr p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  mapped_type *pmVar4;
  string *extraout_RAX;
  undefined4 in_register_00000014;
  long lVar5;
  char *pcVar6;
  size_type __dnew;
  string sourceString;
  string message;
  ostringstream source;
  stringstream ssboString;
  key_type local_3f8;
  undefined1 local_3d8 [32];
  _Base_ptr p_Stack_3b8;
  size_t local_3b0;
  size_type local_3a8;
  string local_3a0;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370;
  undefined7 uStack_36f;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  ostringstream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var3 = &local_360._M_impl.super__Rb_tree_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_360._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  std::__cxx11::ostringstream::ostringstream(local_330);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  local_3a0._M_string_length = 0;
  local_3a0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_380 = &local_370;
  local_378 = 0;
  local_370 = 0;
  if (*(char *)(CONCAT44(in_register_00000014,shaderType) + 0x100) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"\tmediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"\thighp mat4 ${MEMBER_NAME};\n",0x1c);
    lVar5 = 0x1b;
    pcVar6 = "\tlowp ${MEMBER_TYPE} data;\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"\tlowp ${MEMBER_TYPE} data;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"\thighp mat4 ${MEMBER_NAME};\n",0x1c);
    lVar5 = 0x2e;
    pcVar6 = "\tmediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"\tmediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n",0x32);
  p_Var1 = (_Base_ptr)(local_3d8 + 8);
  local_3d8._8_4_ = _S_red;
  local_3d8._16_8_ = (_Base_ptr)0x0;
  local_3b0 = 0;
  paVar2 = &local_3f8.field_2;
  local_3a8 = 0x18;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  local_3d8._24_8_ = p_Var1;
  p_Stack_3b8 = p_Var1;
  local_3f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_3a8);
  local_3f8.field_2._M_allocated_capacity._0_5_ = (undefined5)local_3a8;
  local_3f8.field_2._M_allocated_capacity._5_2_ = (undefined2)(local_3a8 >> 0x28);
  local_3f8.field_2._M_local_buf[7] = (char)(local_3a8 >> 0x38);
  builtin_strncpy(local_3f8._M_dataplus._M_p,"NEGATIVE_CONTEXT_VERSION",0x18);
  local_3f8._M_string_length = local_3a8;
  local_3f8._M_dataplus._M_p[local_3a8] = '\0';
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3f8.field_2._M_allocated_capacity._0_5_ = 0x465f445453;
  local_3f8.field_2._M_allocated_capacity._5_2_ = 0x524f;
  local_3f8.field_2._M_local_buf[7] = 'M';
  local_3f8.field_2._8_2_ = 0x5441;
  local_3f8._M_string_length = 10;
  local_3f8.field_2._M_local_buf[10] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3f8.field_2._M_allocated_capacity._0_5_ = 0x49444e4942;
  local_3f8.field_2._M_allocated_capacity._5_2_ = 0x474e;
  local_3f8.field_2._M_local_buf[7] = '_';
  local_3f8.field_2._8_2_ = 0x4f50;
  local_3f8.field_2._M_local_buf[10] = 'I';
  local_3f8.field_2._M_local_buf[0xb] = 'N';
  local_3f8.field_2._M_local_buf[0xc] = 'T';
  local_3f8._M_string_length = 0xd;
  local_3f8.field_2._M_local_buf[0xd] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3f8.field_2._M_allocated_capacity._0_5_ = 0x495254414d;
  local_3f8.field_2._M_allocated_capacity._5_2_ = 0x5f58;
  local_3f8.field_2._M_local_buf[7] = 'O';
  local_3f8.field_2._8_2_ = 0x4452;
  local_3f8.field_2._M_local_buf[10] = 'E';
  local_3f8.field_2._M_local_buf[0xb] = 'R';
  local_3f8._M_string_length = 0xc;
  local_3f8.field_2._M_local_buf[0xc] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3f8.field_2._M_allocated_capacity._0_5_ = 0x45424d454d;
  local_3f8.field_2._M_allocated_capacity._5_2_ = 0x5f52;
  local_3f8.field_2._M_local_buf[7] = 'T';
  local_3f8.field_2._8_2_ = 0x5059;
  local_3f8.field_2._M_local_buf[10] = 'E';
  local_3f8._M_string_length = 0xb;
  local_3f8.field_2._M_local_buf[0xb] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3f8.field_2._M_allocated_capacity._0_5_ = 0x45424d454d;
  local_3f8.field_2._M_allocated_capacity._5_2_ = 0x5f52;
  local_3f8.field_2._M_local_buf[7] = 'N';
  local_3f8.field_2._8_2_ = 0x4d41;
  local_3f8.field_2._M_local_buf[10] = 'E';
  local_3f8._M_string_length = 0xb;
  local_3f8.field_2._M_local_buf[0xb] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3a8 = 0x12;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  local_3f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_3a8);
  local_3f8.field_2._M_allocated_capacity._0_5_ = (undefined5)local_3a8;
  local_3f8.field_2._M_allocated_capacity._5_2_ = (undefined2)(local_3a8 >> 0x28);
  local_3f8.field_2._M_local_buf[7] = (char)(local_3a8 >> 0x38);
  builtin_strncpy(local_3f8._M_dataplus._M_p,"MEMBER_FIXED_ARRAY",0x12);
  local_3f8._M_string_length = local_3a8;
  local_3f8._M_dataplus._M_p[local_3a8] = '\0';
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_3a8 = 0x15;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  local_3f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_3a8);
  local_3f8.field_2._M_allocated_capacity._0_5_ = (undefined5)local_3a8;
  local_3f8.field_2._M_allocated_capacity._5_2_ = (undefined2)(local_3a8 >> 0x28);
  local_3f8.field_2._M_local_buf[7] = (char)(local_3a8 >> 0x38);
  builtin_strncpy(local_3f8._M_dataplus._M_p,"MEMBER_VARIABLE_ARRAY",0x15);
  local_3f8._M_string_length = local_3a8;
  local_3f8._M_dataplus._M_p[local_3a8] = '\0';
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3d8,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             CONCAT25(local_3f8.field_2._M_allocated_capacity._5_2_,
                                      local_3f8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&local_360);
  if ((_Base_ptr)local_3d8._16_8_ != (_Base_ptr)0x0) {
    local_360._M_impl.super__Rb_tree_header._M_header._M_color = local_3d8._8_4_;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_3d8._16_8_;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_3d8._24_8_;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_3b8;
    *(_Rb_tree_header **)(local_3d8._16_8_ + 8) = p_Var3;
    local_360._M_impl.super__Rb_tree_header._M_node_count = local_3b0;
    local_3d8._16_8_ = (_Base_ptr)0x0;
    local_3b0 = 0;
    local_3d8._24_8_ = p_Var1;
    p_Stack_3b8 = p_Var1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3d8);
  if ((int)this == 0x8b31) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"${NEGATIVE_CONTEXT_VERSION}\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"layout (location = 0) in highp vec4 position;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"layout (location = 1) in mediump vec4 colour;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"out mediump vec4 vertex_colour;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"{\n",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,(char *)local_3d8._0_8_,
               CONCAT44(local_3d8._12_4_,local_3d8._8_4_));
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"} ssbo;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tmediump vec4 variable;\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tgl_Position = ssbo.${MEMBER_NAME} * position;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tfor (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n",0x37
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\t{\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\t\tvariable += ssbo.array_1[idx];\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\t}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tvertex_colour = colour + variable;\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
    }
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3f8,&local_3a0);
    tcu::StringTemplate::specialize
              ((string *)local_3d8,(StringTemplate *)&local_3f8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_360);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"${NEGATIVE_CONTEXT_VERSION}\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"in mediump vec4 vertex_colour;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"layout (location = 0) out mediump vec4 fragment_colour;\n",0x38
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"{\n",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,(char *)local_3d8._0_8_,
               CONCAT44(local_3d8._12_4_,local_3d8._8_4_));
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"} ssbo;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tmediump vec4 variable;\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tvariable * ssbo.${MEMBER_NAME};\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tfor (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n",0x37
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\t{\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\t\tvariable += ssbo.array_1[idx];\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\t}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"\tfragment_colour = vertex_colour + variable;\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
    }
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3f8,&local_3a0);
    tcu::StringTemplate::specialize
              ((string *)local_3d8,(StringTemplate *)&local_3f8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_360);
  }
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_3d8);
  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_3f8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar2 = &local_3a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p == paVar2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,local_3a0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_3a0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_3a0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,local_3a0.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_3a0._M_string_length;
  local_3a0._M_string_length = 0;
  local_3a0.field_2._M_local_buf[0] = '\0';
  local_3a0._M_dataplus._M_p = (pointer)paVar2;
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a0._M_dataplus._M_p,
                    CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                             local_3a0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_330);
  std::ios_base::~ios_base(local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_360);
  return extraout_RAX;
}

Assistant:

std::string generateVaryingSSBOShader(const glw::GLenum shaderType, const args::SsboArgs& args, tcu::TestLog& log)
{
	std::map<std::string, std::string>	argsMap;
	std::ostringstream					source;
	std::string							sourceString;
	std::stringstream					ssboString;
	std::string							message;

	if (args.getMemberReorder())
	{
		ssboString	<< "	mediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n"
					<< "	highp mat4 ${MEMBER_NAME};\n"
					<< "	lowp ${MEMBER_TYPE} data;\n"
					<< "	mediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n";
	}
	else
	{
		ssboString	<< "	lowp ${MEMBER_TYPE} data;\n"
					<< "	highp mat4 ${MEMBER_NAME};\n"
					<< "	mediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n"
					<< "	mediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n";
	}

	argsMap = args.populateArgsMap();

	switch (shaderType)
	{
		case GL_VERTEX_SHADER:
		{
			source	<< "${NEGATIVE_CONTEXT_VERSION}\n"
					<< "layout (location = 0) in highp vec4 position;\n"
					<< "layout (location = 1) in mediump vec4 colour;\n"
					<< "out mediump vec4 vertex_colour;\n"
					<< "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
					<< "{\n";

			source << ssboString.str();

			source	<< "} ssbo;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	mediump vec4 variable;\n"
					<< "	gl_Position = ssbo.${MEMBER_NAME} * position;\n"
					<< "	for (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n"
					<< "	{\n"
					<< "		variable += ssbo.array_1[idx];\n"
					<< "	}\n"
					<< "	vertex_colour = colour + variable;\n"
					<< "}\n";

			sourceString = source.str();
			sourceString = tcu::StringTemplate(sourceString).specialize(argsMap);

			return sourceString;
		}

		case GL_FRAGMENT_SHADER:
		{
			source	<< "${NEGATIVE_CONTEXT_VERSION}\n"
					<< "in mediump vec4 vertex_colour;\n"
					<< "layout (location = 0) out mediump vec4 fragment_colour;\n"
					<< "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
					<< "{\n";

			source << ssboString.str();

			source	<< "} ssbo;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	mediump vec4 variable;\n"
					<< "	variable * ssbo.${MEMBER_NAME};\n"
					<< "	for (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n"
					<< "	{\n"
					<< "		variable += ssbo.array_1[idx];\n"
					<< "	}\n"
					<< "	fragment_colour = vertex_colour + variable;\n"
					<< "}\n";

			sourceString = source.str();
			sourceString = tcu::StringTemplate(sourceString).specialize(argsMap);

			return sourceString;
		}

		case GL_GEOMETRY_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_TESS_CONTROL_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_TESS_EVALUATION_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_COMPUTE_SHADER:
		{
			// TODO:
			return sourceString;
		}

		default:
		{
			message = "shader type not recognised.";
			log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		}
	}

	return std::string();
}